

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O1

bool dxil_spv::analyze_getelementptr_instruction(Impl *impl,GetElementPtrInst *inst)

{
  undefined4 uVar1;
  ulong uVar2;
  GetElementPtrInst *this;
  bool bVar3;
  ValueKind VVar4;
  uint uVar5;
  Value *pVVar6;
  mapped_type *pmVar7;
  LoggingCallback p_Var8;
  void *pvVar9;
  ulong uVar10;
  __hashtable *__h;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  __node_base_ptr p_Var13;
  __node_gen_type __node_gen;
  AllocaTrackedIndex tracking;
  GetElementPtrInst *local_1058;
  _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1050;
  _Hash_node_base *local_1048;
  GlobalVariable *local_1040;
  undefined1 local_1038 [32];
  char local_1018 [4072];
  
  local_1058 = inst;
  pVVar6 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,0);
  this = local_1058;
  uVar2 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_bucket_count;
  uVar10 = (ulong)pVVar6 % uVar2;
  p_Var11 = (impl->llvm_global_variable_to_resource_mapping)._M_h._M_buckets[uVar10];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var12 = p_Var11->_M_nxt, p_Var13 = p_Var11, pVVar6 != (Value *)p_Var11->_M_nxt[1]._M_nxt)) {
    while (p_Var11 = p_Var12, p_Var12 = p_Var11->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)p_Var12[1]._M_nxt % uVar2 != uVar10) ||
         (p_Var13 = p_Var11, pVVar6 == (Value *)p_Var12[1]._M_nxt)) goto LAB_001589a6;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_001589a6:
  if (p_Var13 == (__node_base_ptr)0x0) {
    p_Var12 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var12 = p_Var13->_M_nxt;
  }
  if (p_Var12 == (_Hash_node_base *)0x0) {
LAB_00158ac4:
    gep_pointer_to_alloca_tracked_inst((AllocaTrackedIndex *)local_1038,impl,(Value *)local_1058);
    if ((GetElementPtrInst *)local_1038._0_8_ != (GetElementPtrInst *)0x0) {
      std::
      _Hashtable<LLVMBC::GetElementPtrInst_const*,LLVMBC::GetElementPtrInst_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::GetElementPtrInst_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::GetElementPtrInst_const*>,std::hash<LLVMBC::GetElementPtrInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<LLVMBC::GetElementPtrInst_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<LLVMBC::GetElementPtrInst_const*,false>>>>
                ((_Hashtable<LLVMBC::GetElementPtrInst_const*,LLVMBC::GetElementPtrInst_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::GetElementPtrInst_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::GetElementPtrInst_const*>,std::hash<LLVMBC::GetElementPtrInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&impl->masked_alloca_forward_gep,&local_1058);
    }
    bVar3 = true;
  }
  else {
    pVVar6 = LLVMBC::Instruction::getOperand(&local_1058->super_Instruction,1);
    pVVar6 = LLVMBC::Internal::resolve_proxy(pVVar6);
    VVar4 = LLVMBC::Value::get_value_kind(pVVar6);
    if (VVar4 == ConstantInt) {
      uVar5 = LLVMBC::Instruction::getNumOperands(&this->super_Instruction);
      if (uVar5 == 3) {
        local_1050 = (_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&impl->llvm_global_variable_to_resource_mapping;
        local_1048 = p_Var12[2]._M_nxt;
        local_1040 = (GlobalVariable *)p_Var12[4]._M_nxt;
        uVar5 = *(uint *)((long)&p_Var12[5]._M_nxt + 4);
        uVar1 = *(undefined4 *)((long)&p_Var12[5]._M_nxt + 1);
        pVVar6 = LLVMBC::Instruction::getOperand(&this->super_Instruction,2);
        local_1038._16_5_ = 0x6f6e2e7864;
        local_1038._21_3_ = 0x6e756e;
        local_1038._24_5_ = 0x6d726f6669;
        local_1038._8_8_ = (Value *)0xd;
        local_1038[0x1d] = '\0';
        local_1038._0_8_ = local_1038 + 0x10;
        bVar3 = LLVMBC::Instruction::hasMetadata(&this->super_Instruction,(String *)local_1038);
        if ((undefined1 *)local_1038._0_8_ != local_1038 + 0x10) {
          free_in_thread((void *)local_1038._0_8_);
        }
        local_1038._0_8_ = this;
        pmVar7 = std::__detail::
                 _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_1050,(key_type *)local_1038);
        *(_Hash_node_base **)pmVar7 = local_1048;
        pmVar7->offset = pVVar6;
        pmVar7->variable = local_1040;
        pmVar7->non_uniform = bVar3;
        *(undefined4 *)&pmVar7->field_0x19 = uVar1;
        *(int *)&pmVar7->field_0x1c = (int)(CONCAT44(uVar5 >> 8,uVar1) >> 0x18);
        goto LAB_00158ac4;
      }
      p_Var8 = get_thread_log_callback();
      if (p_Var8 != (LoggingCallback)0x0) {
        memcpy(local_1038,
               "Number of operands to getelementptr for a resource handle is unexpected.\n",0x4a);
        goto LAB_00158b5c;
      }
      analyze_getelementptr_instruction();
    }
    else {
      p_Var8 = get_thread_log_callback();
      if (p_Var8 == (LoggingCallback)0x0) {
        analyze_getelementptr_instruction();
      }
      else {
        builtin_strncpy(local_1018,"ot constant 0.\n",0x10);
        local_1038._16_5_ = 0x6f20727450;
        local_1038._21_3_ = 0x726570;
        local_1038._24_5_ = 0x6920646e61;
        local_1038[0x1d] = 's';
        local_1038._30_2_ = 0x6e20;
        local_1038[0] = 'F';
        local_1038[1] = 'i';
        local_1038[2] = 'r';
        local_1038[3] = 's';
        local_1038[4] = 't';
        local_1038[5] = ' ';
        local_1038[6] = 'G';
        local_1038[7] = 'e';
        local_1038[8] = 't';
        local_1038[9] = 'E';
        local_1038[10] = 'l';
        local_1038[0xb] = 'e';
        local_1038[0xc] = 'm';
        local_1038[0xd] = 'e';
        local_1038[0xe] = 'n';
        local_1038[0xf] = 't';
LAB_00158b5c:
        pvVar9 = get_thread_log_callback_userdata();
        (*p_Var8)(pvVar9,Error,local_1038);
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool analyze_getelementptr_instruction(Converter::Impl &impl, const llvm::GetElementPtrInst *inst)
{
	auto itr = impl.llvm_global_variable_to_resource_mapping.find(inst->getOperand(0));
	if (itr != impl.llvm_global_variable_to_resource_mapping.end() &&
	    !emit_getelementptr_resource(impl, inst, itr->second))
	{
		return false;
	}

	// If this GEP is associated with a tracked alloca, we might want to mask the GEP
	// if this GEP is actually never consumed.
	// Avoids lots of dead code being emitted which looks goofy in disassemblies.
	auto tracking = gep_pointer_to_alloca_tracked_inst(impl, inst);
	if (tracking.alloca_inst)
		impl.masked_alloca_forward_gep.insert(inst);

	return true;
}